

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  bool bVar2;
  undefined4 uVar3;
  TValue *t_00;
  TValue *io;
  TValue *slot;
  StkId t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2addr(L,idx);
  if (t_00->tt_ == 0x45) {
    io = luaH_getint((Table *)(t_00->value_).gc,n);
    if (io->tt_ == 0) {
      bVar2 = false;
    }
    else {
      if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((t_00->value_).gc)->marked & 4) != 0)) &&
         (((L->top[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t_00->value_).gc);
      }
      pTVar1 = L->top;
      io->value_ = pTVar1[-1].value_;
      uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
      io->tt_ = pTVar1[-1].tt_;
      *(undefined4 *)&io->field_0xc = uVar3;
      bVar2 = true;
    }
    if (bVar2) {
      L->top = L->top + -1;
      return;
    }
  }
  else {
    io = (TValue *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).i = n;
  pTVar1->tt_ = 0x13;
  L->top = L->top + 1;
  luaV_finishset(L,t_00,L->top + -1,L->top + -2,io);
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  if (luaV_fastset(L, t, n, slot, luaH_getint, L->top - 1))
    L->top--;  /* pop value */
  else {
    setivalue(L->top, n);
    api_incr_top(L);
    luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
    L->top -= 2;  /* pop value and key */
  }
  lua_unlock(L);
}